

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O2

RecyclerWeakReference<Js::DynamicType> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<Js::DynamicType,_Js::DynamicType_*,_DefaultComparer<const_Js::DynamicType_*>,_true>
         *this,DynamicType *key,DynamicType *value,bool add,bool checkForExisting)

{
  int iVar1;
  RecyclerWeakReference<Js::DynamicType> *pRVar2;
  undefined7 in_register_00000009;
  uint key_00;
  int local_3c;
  undefined4 local_38;
  int previous;
  uint bucket;
  
  local_38 = (undefined4)CONCAT71(in_register_00000009,add);
  if ((this->buckets).ptr == (int *)0x0) {
    Initialize(this,0);
  }
  key_00 = (uint)((ulong)key >> 3) | 1;
  previous = PrimePolicy::ModPrime(key_00,this->size,this->modFunctionIndex);
  if (checkForExisting) {
    local_3c = -1;
    iVar1 = FindEntry<Js::DynamicType>(this,key,key_00,(uint *)&previous,&local_3c);
    if (iVar1 != -1) {
      if ((char)local_38 == '\0') {
        Memory::WriteBarrierPtr<Js::DynamicType>::WriteBarrierSet
                  (&(this->entries).ptr[iVar1].value,value);
        this->version = this->version + 1;
        return (this->entries).ptr[iVar1].key.ptr;
      }
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
  }
  pRVar2 = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>(this->recycler,key);
  pRVar2 = Insert(this,pRVar2,value,key_00,previous);
  return pRVar2;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(TKey* key, TValue value, bool add, bool checkForExisting = true)
        {
            if (buckets == nullptr) Initialize(0);

            hash_t hash = GetHashCode(key);
            uint bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);

            if (checkForExisting)
            {
                int previous = -1;
                int i = FindEntry(key, hash, bucket, previous);

                if (i != -1)
                {
                    if (add)
                    {
                        Js::Throw::FatalInternalError();
                    }

                    entries[i].value = value;
                    version++;
                    return entries[i].key;
                }
            }

            // We know we need to insert- so first try creating the weak reference, before adding it to
            // the dictionary. If we OOM here, we still leave the dictionary as we found it.
            const RecyclerWeakReference<TKey>* weakRef = recycler->CreateWeakReferenceHandle<TKey>(key);

            return Insert(weakRef, value, hash, bucket);
        }